

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idasRoberts_ASAi_dns.c
# Opt level: O1

int resB(sunrealtype tt,N_Vector yy,N_Vector yp,N_Vector yyB,N_Vector ypB,N_Vector rrB,
        void *user_dataB)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  long lVar8;
  double *pdVar9;
  double *pdVar10;
  double dVar11;
  
  dVar1 = *(double *)((long)user_dataB + 8);
  dVar2 = *(double *)((long)user_dataB + 0x10);
  lVar8 = *(long *)((long)yy->content + 0x10);
  dVar3 = *(double *)(lVar8 + 8);
  pdVar9 = *(double **)((long)yyB->content + 0x10);
  dVar4 = pdVar9[1];
  dVar5 = pdVar9[2];
  pdVar10 = *(double **)((long)ypB->content + 0x10);
  dVar6 = pdVar10[1];
  dVar11 = dVar4 - *pdVar9;
  pdVar9 = *(double **)((long)rrB->content + 0x10);
  dVar7 = *(double *)(lVar8 + 0x10);
  *pdVar9 = (*pdVar10 + dVar11 * *user_dataB) - dVar5;
  pdVar9[1] = ((dVar6 - dVar1 * dVar7 * dVar11) + dVar2 * -2.0 * dVar3 * dVar4) - dVar5;
  pdVar9[2] = (-dVar1 * dVar3 * dVar11 - dVar5) + 1.0;
  return 0;
}

Assistant:

static int resB(sunrealtype tt, N_Vector yy, N_Vector yp, N_Vector yyB,
                N_Vector ypB, N_Vector rrB, void* user_dataB)
{
  UserData data;
  sunrealtype y2, y3;
  sunrealtype p1, p2, p3;
  sunrealtype l1, l2, l3;
  sunrealtype lp1, lp2;
  sunrealtype l21;

  data = (UserData)user_dataB;

  /* The p vector */
  p1 = data->p[0];
  p2 = data->p[1];
  p3 = data->p[2];

  /* The y  vector */
  y2 = Ith(yy, 2);
  y3 = Ith(yy, 3);

  /* The lambda vector */
  l1 = Ith(yyB, 1);
  l2 = Ith(yyB, 2);
  l3 = Ith(yyB, 3);

  /* The lambda dot vector */
  lp1 = Ith(ypB, 1);
  lp2 = Ith(ypB, 2);

  /* Temporary variables */
  l21 = l2 - l1;

  /* Load residual. */
  Ith(rrB, 1) = lp1 + p1 * l21 - l3;
  Ith(rrB, 2) = lp2 - p2 * y3 * l21 - SUN_RCONST(2.0) * p3 * y2 * l2 - l3;
  Ith(rrB, 3) = -p2 * y2 * l21 - l3 + SUN_RCONST(1.0);

  return (0);
}